

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

cmLinkLineComputer * __thiscall
cmMakefileTargetGenerator::CreateLinkLineComputer
          (cmMakefileTargetGenerator *this,cmOutputConverter *outputConverter,
          cmStateDirectory *stateDir)

{
  cmMakefile *this_00;
  cmGlobalUnixMakefileGenerator3 *this_01;
  bool bVar1;
  int iVar2;
  cmLinkLineComputer *pcVar3;
  undefined4 extraout_var;
  allocator local_51;
  string local_50;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string((string *)&local_50,"MSVC60",&local_51);
  bVar1 = cmMakefile::IsOn(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_01 = this->GlobalGenerator;
  if (bVar1) {
    pcVar3 = cmGlobalGenerator::CreateMSVC60LinkLineComputer
                       ((cmGlobalGenerator *)this_01,outputConverter,stateDir);
  }
  else {
    iVar2 = (*(this_01->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[0xc])(this_01,outputConverter,stateDir);
    pcVar3 = (cmLinkLineComputer *)CONCAT44(extraout_var,iVar2);
  }
  return pcVar3;
}

Assistant:

cmLinkLineComputer* cmMakefileTargetGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter, cmStateDirectory const& stateDir)
{
  if (this->Makefile->IsOn("MSVC60")) {
    return this->GlobalGenerator->CreateMSVC60LinkLineComputer(outputConverter,
                                                               stateDir);
  }
  return this->GlobalGenerator->CreateLinkLineComputer(outputConverter,
                                                       stateDir);
}